

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O2

void set_Xmouseposition(int x,int y)

{
  int iVar1;
  int iVar2;
  
  iVar2 = ((x & 0xffffU) + Current_Hot_X) - (currentdsp->Visible).x;
  if (-1 < iVar2) {
    iVar1 = ((y & 0xffffU) + Current_Hot_Y) - (currentdsp->Visible).y;
    if ((-1 < iVar1 && iVar2 <= (int)(currentdsp->Visible).width) &&
       (iVar1 <= (int)(currentdsp->Visible).height)) {
      XWarpPointer(currentdsp->display_id,0,currentdsp->DisplayWindow,0,0,0,0,iVar2,iVar1);
      XFlush(currentdsp->display_id);
      return;
    }
  }
  return;
}

Assistant:

void set_Xmouseposition(int x, int y)
{
  int dest_x, dest_y;

  TPRINT(("set_Xmouseposition(%d,%d)\n", x, y));

  dest_x = (x & 0xFFFF) + Current_Hot_X - currentdsp->Visible.x;
  dest_y = (y & 0xFFFF) + Current_Hot_Y - currentdsp->Visible.y;

  if ((dest_x >= 0) && (dest_x <= (int)currentdsp->Visible.width) && (dest_y >= 0) &&
      (dest_y <= (int)currentdsp->Visible.height)) {
    XLOCK;
    XWarpPointer(currentdsp->display_id, (Window)NULL, currentdsp->DisplayWindow, 0, 0, 0, 0,
                 dest_x, dest_y);
    XFlush(currentdsp->display_id);
    XUNLOCK(currentdsp);
  }
}